

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O0

int PrintOutput(void *mem,sunrealtype t,N_Vector y)

{
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunrealtype hused;
  long nst;
  int kused;
  int retval;
  sunrealtype *yval;
  undefined8 local_38;
  undefined8 local_30;
  uint local_28;
  int local_24;
  undefined8 *local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  local_20 = (undefined8 *)N_VGetArrayPointer(in_RSI);
  local_24 = IDAGetLastOrder(local_8,&local_28);
  local_24 = IDAGetNumSteps(local_8,&local_30);
  local_24 = IDAGetLastStep(local_8,&local_38);
  printf("%10.4e %12.4e %12.4e %12.4e %3ld  %1d %12.4e\n",local_10,*local_20,local_20[1],local_20[2]
         ,local_38,local_30,(ulong)local_28);
  return local_24;
}

Assistant:

static int PrintOutput(void* mem, sunrealtype t, N_Vector y)
{
  sunrealtype* yval;
  int retval, kused;
  long int nst;
  sunrealtype hused;

  yval = N_VGetArrayPointer(y);

  retval = IDAGetLastOrder(mem, &kused);
  retval = IDAGetNumSteps(mem, &nst);
  retval = IDAGetLastStep(mem, &hused);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%10.4Le %12.4Le %12.4Le %12.4Le %3ld  %1d %12.4Le\n", t, yval[0],
         yval[1], yval[2], nst, kused, hused);
#else
  printf("%10.4e %12.4e %12.4e %12.4e %3ld  %1d %12.4e\n", t, yval[0], yval[1],
         yval[2], nst, kused, hused);
#endif

  return (retval);
}